

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O2

void __thiscall luna::ParseException::ParseException(ParseException *this,char *str,TokenDetail *t)

{
  String *pSVar1;
  char local_4a [2];
  anon_union_16_2_eed97686_for_String_2 *local_48;
  char *str_local;
  string local_38;
  
  (this->super_Exception).what_._M_dataplus._M_p = (pointer)&(this->super_Exception).what_.field_2;
  (this->super_Exception).what_._M_string_length = 0;
  (this->super_Exception).what_.field_2._M_local_buf[0] = '\0';
  pSVar1 = t->module_;
  if ((pSVar1->super_GCObject).field_0x11 == '\0') {
    local_48 = &pSVar1->field_1;
  }
  else {
    local_48 = (anon_union_16_2_eed97686_for_String_2 *)(pSVar1->field_1).str_;
  }
  local_4a[1] = 0x3a;
  local_4a[0] = ':';
  str_local = str;
  GetTokenStr_abi_cxx11_(&local_38,(luna *)t,t);
  Exception::
  SetWhat<char_const*,char,int_const&,char,int_const&,char_const(&)[3],std::__cxx11::string,char_const(&)[3],char_const*&>
            (&this->super_Exception,(char **)&local_48,local_4a + 1,&t->line_,local_4a,&t->column_,
             (char (*) [3])0x175ec6,&local_38,(char (*) [3])"\' ",&str_local);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

ParseException(const char *str, const TokenDetail &t)
        {
            SetWhat(t.module_->GetCStr(), ':', t.line_, ':', t.column_, " '",
                    GetTokenStr(t), "' ", str);
        }